

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_c_function_data_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte bVar3;
  undefined2 uVar4;
  code *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  JSValue *pJVar8;
  int64_t iVar9;
  long lVar10;
  int64_t *piVar11;
  undefined8 *puVar12;
  JSValue JVar13;
  int64_t iStack_18;
  
  iVar9 = this_val.tag;
  if (((int)func_obj.tag == -1) && (*(short *)((long)func_obj.u.ptr + 6) == 0xf)) {
    puVar12 = *(undefined8 **)((long)func_obj.u.ptr + 0x30);
  }
  else {
    puVar12 = (undefined8 *)0x0;
  }
  pJVar8 = (JSValue *)&iStack_18;
  bVar3 = *(byte *)(puVar12 + 1);
  iStack_18 = iVar9;
  if (argc < (int)(uint)bVar3) {
    pJVar8 = (JSValue *)(&iStack_18 + (ulong)bVar3 * -2);
    lVar10 = 0;
    uVar7 = 0;
    if (0 < argc) {
      uVar7 = (ulong)(uint)argc;
    }
    for (; uVar7 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      puVar1 = (undefined8 *)((long)&argv->u + lVar10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pJVar8->u + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
    }
    lVar10 = (long)argc;
    piVar11 = &pJVar8[lVar10].tag;
    for (; argv = pJVar8, lVar10 < (long)(ulong)bVar3; lVar10 = lVar10 + 1) {
      (((JSValue *)(piVar11 + -1))->u).int32 = 0;
      *piVar11 = 3;
      piVar11 = piVar11 + 2;
    }
  }
  uVar4 = *(undefined2 *)((long)puVar12 + 10);
  pJVar8[-1].u.ptr = puVar12 + 2;
  pcVar5 = (code *)*puVar12;
  pJVar8[-2].tag = 0x114200;
  JVar13 = (JSValue)(*pcVar5)(ctx,this_val.u.float64,iVar9,argc,argv,uVar4);
  return JVar13;
}

Assistant:

static JSValue js_c_function_data_call(JSContext *ctx, JSValueConst func_obj,
                                       JSValueConst this_val,
                                       int argc, JSValueConst *argv, int flags)
{
    JSCFunctionDataRecord *s = JS_GetOpaque(func_obj, JS_CLASS_C_FUNCTION_DATA);
    JSValueConst *arg_buf;
    int i;

    /* XXX: could add the function on the stack for debug */
    if (unlikely(argc < s->length)) {
        arg_buf = alloca(sizeof(arg_buf[0]) * s->length);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < s->length; i++)
            arg_buf[i] = JS_UNDEFINED;
    } else {
        arg_buf = argv;
    }

    return s->func(ctx, this_val, argc, arg_buf, s->magic, s->data);
}